

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<unsigned_int>::addAll<unsigned_int*,true>
          (ArrayBuilder<unsigned_int> *this,uint *start,uint *end)

{
  uint *puVar1;
  uint *end_local;
  uint *start_local;
  ArrayBuilder<unsigned_int> *this_local;
  
  puVar1 = kj::_::CopyConstructArray_<unsigned_int,_unsigned_int_*,_true,_false>::apply
                     (this->pos,start,end);
  this->pos = puVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}